

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

void __thiscall
Model::update_schoenberg_multiple_kernel
          (Model *this,vector<double,_std::allocator<double>_> *labels,
          vector<int,_std::allocator<int>_> *contextIds,int centerId,double current_lr,
          int numOfKernels,double **kernelCoefficients)

{
  size_t __n;
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  pointer piVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  uVar12 = -(ulong)((ulong)this->dim_size == 0) | (ulong)this->dim_size * 8;
  puVar4 = (undefined8 *)operator_new__(uVar12);
  *puVar4 = 0;
  __n = uVar12 - 8;
  memset(puVar4 + 1,0,__n);
  puVar5 = (undefined8 *)operator_new__(uVar12);
  *puVar5 = 0;
  memset(puVar5 + 1,0,__n);
  puVar6 = (undefined8 *)operator_new__(uVar12);
  *puVar6 = 0;
  memset(puVar6 + 1,0,__n);
  puVar7 = (undefined8 *)operator_new__(uVar12);
  *puVar7 = 0;
  memset(puVar7 + 1,0,__n);
  piVar9 = (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (ulong)(uint)numOfKernels;
  if ((contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar9) {
    uVar11 = 0;
    do {
      uVar8 = (ulong)this->dim_size;
      dVar13 = 1.0;
      if (uVar8 != 0) {
        pdVar2 = this->emb1[piVar9[uVar11]];
        pdVar3 = this->emb0[centerId];
        uVar10 = 0;
        do {
          puVar7[uVar10] = pdVar2[uVar10] - pdVar3[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        dVar13 = 0.0;
        uVar10 = 0;
        do {
          dVar13 = dVar13 + (double)puVar7[uVar10] * (double)puVar7[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        dVar13 = dVar13 + 1.0;
      }
      if (numOfKernels < 1) {
        dVar15 = 0.0;
        dVar16 = 0.0;
      }
      else {
        dVar16 = 0.0;
        dVar15 = 0.0;
        uVar8 = 0;
        do {
          uVar10 = uVar8 + 1;
          dVar14 = pow(1.0 / dVar13,this->kernelParams[uVar8 + 1]);
          dVar16 = dVar16 + dVar14 * (*kernelCoefficients)[uVar8];
          dVar14 = dVar14 * (*kernelCoefficients)[uVar8] * (1.0 / dVar13);
          dVar15 = dVar15 + dVar14 + dVar14;
          uVar8 = uVar10;
        } while (uVar12 != uVar10);
      }
      uVar8 = (ulong)this->dim_size;
      if (uVar8 != 0) {
        dVar16 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11] - dVar16;
        uVar10 = 0;
        do {
          puVar6[uVar10] = (double)puVar7[uVar10] * dVar15 * (dVar16 + dVar16);
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        uVar10 = 0;
        do {
          puVar5[uVar10] = (double)puVar6[uVar10] * -current_lr;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        uVar10 = 0;
        do {
          puVar4[uVar10] = (double)puVar5[uVar10] + (double)puVar4[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
        pdVar2 = this->emb1
                 [(contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar11]];
        uVar10 = 0;
        do {
          dVar13 = pdVar2[uVar10];
          pdVar2[uVar10] = ((double)puVar5[uVar10] - this->lambda * current_lr * dVar13) + dVar13;
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      uVar11 = uVar11 + 1;
      piVar9 = (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
  }
  uVar1 = this->dim_size;
  if ((ulong)uVar1 != 0) {
    pdVar2 = this->emb0[centerId];
    uVar11 = 0;
    do {
      dVar13 = pdVar2[uVar11];
      pdVar2[uVar11] = (-this->lambda * current_lr * dVar13 - (double)puVar4[uVar11]) + dVar13;
      uVar11 = uVar11 + 1;
    } while (uVar1 != uVar11);
  }
  operator_delete__(puVar4);
  operator_delete__(puVar5);
  operator_delete__(puVar7);
  operator_delete__(puVar6);
  uVar11 = 0xffffffffffffffff;
  if (0 < numOfKernels) {
    uVar11 = (long)numOfKernels << 3;
  }
  puVar4 = (undefined8 *)operator_new__(uVar11);
  *puVar4 = 0;
  memset(puVar4 + 1,0,uVar11 - 8);
  puVar5 = (undefined8 *)operator_new__(uVar11);
  *puVar5 = 0;
  memset(puVar5 + 1,0,uVar11 - 8);
  if ((contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (contextIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar11 = 0;
    do {
      if (numOfKernels < 1) {
        dVar13 = 0.0;
      }
      else {
        dVar13 = 0.0;
        uVar8 = 0;
        do {
          uVar10 = uVar8 + 1;
          dVar16 = schoenberg_kernel(this,(contextIds->super__Vector_base<int,_std::allocator<int>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar11],
                                     centerId,this->kernelParams[uVar8 + 1]);
          puVar4[uVar8] = dVar16;
          dVar13 = dVar13 + dVar16 * (*kernelCoefficients)[uVar8];
          uVar8 = uVar10;
        } while (uVar12 != uVar10);
      }
      if (0 < numOfKernels) {
        dVar13 = (labels->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11] - dVar13;
        uVar8 = 0;
        do {
          puVar5[uVar8] = (double)puVar5[uVar8] - (double)puVar4[uVar8] * (dVar13 + dVar13);
          uVar8 = uVar8 + 1;
        } while (uVar12 != uVar8);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(contextIds->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  if (0 < numOfKernels) {
    pdVar2 = *kernelCoefficients;
    uVar11 = 0;
    do {
      dVar13 = pdVar2[uVar11];
      pdVar2[uVar11] =
           ((double)puVar5[uVar11] * -current_lr - this->beta * current_lr * dVar13) + dVar13;
      uVar11 = uVar11 + 1;
    } while (uVar12 != uVar11);
  }
  operator_delete__(puVar4);
  return;
}

Assistant:

void Model::update_schoenberg_multiple_kernel(vector <double> labels, vector <int> contextIds, int centerId, double current_lr, int numOfKernels, double *&kernelCoefficients) {

    /* ----------- Update embedding vectors ----------- */
    double *neule;
    double *g, *temp_g;
    double eta, e, *diff,  *z;
    double var;
    double *e_values;

    neule = new double[this->dim_size]{0};
    g = new double[this->dim_size]{0};
    temp_g = new double[this->dim_size]{0};
    z = new double[this->dim_size]{0};
    diff = new double[this->dim_size]{0};
    e_values = new double[this->dim_size]{0};
    double e_values_sum=0;
    double e_values_sum_ext=0;
    double f;

    for(int i = 0; i < contextIds.size(); i++) {

        for (int d = 0; d < this->dim_size; d++)
            diff[d] = this->emb1[contextIds[i]][d] - this->emb0[centerId][d];

        eta = 0.0;
        for (int d = 0; d < this->dim_size; d++)
            eta += diff[d]*diff[d];
        eta = 1.0 / ( 1.0 + eta ); // eta = (1 + (x-y)^2 ) ^ {-1}

        e_values_sum = 0;
        e_values_sum_ext = 0;
        for(int k=0; k < numOfKernels; k++) {
            e = pow(eta, this->kernelParams[k+1]); // ( 1 + (x-y) )^{-\alpha}

            e_values[k] = kernelCoefficients[k] * e;
            e_values_sum += e_values[k];
            e_values_sum_ext += e_values[k] * eta * ( 2.0 );
        }

        f = 2.0 * ( labels[i] - e_values_sum  ) * ( e_values_sum_ext );
        for (int d = 0; d < this->dim_size; d++)
            z[d] = f * ( diff[d] );

        for (int d = 0; d < this->dim_size; d++)
            g[d] = -current_lr * z[d]; // minus comes from the objective function, minimization

        for (int d = 0; d < this->dim_size; d++)
            neule[d] += g[d];

        for (int d = 0; d < this->dim_size; d++)
            this->emb1[contextIds[i]][d] += g[d] - current_lr*this->lambda*(this->emb1[contextIds[i]][d]);
    }
    for (int d = 0; d < this->dim_size; d++)
        this->emb0[centerId][d] += -neule[d] - current_lr*this->lambda*(this->emb0[centerId][d]);


    delete[] neule;
    delete [] g;
    delete [] temp_g;
    delete [] diff;
    delete [] z;
    delete [] e_values;
    /* ------------------------------------------------ */

    /* ---------- Update kernel coefficients ---------- */
    double kernelSum;
    double *ker, *totalKer;

    ker = new double[numOfKernels]{0};
    totalKer = new double[numOfKernels]{0};

    for(int i = 0; i < contextIds.size(); i++) {
        kernelSum = 0;
        for (int k = 0; k < numOfKernels; k++) {
            ker[k] = this->schoenberg_kernel(contextIds[i], centerId, this->kernelParams[k + 1]);
            kernelSum += kernelCoefficients[k] * ker[k];
        }
        for (int k = 0; k < numOfKernels; k++)
            totalKer[k] += 2.0 * ( labels[i] - kernelSum ) * -ker[k];
    }

    for (int k = 0; k < numOfKernels; k++)
        kernelCoefficients[k] += -current_lr * totalKer[k] - current_lr * this->beta * kernelCoefficients[k];

    delete[] ker;
    /* ------------------------------------------------ */


    /* ----------- Update embedding vectors ----------- */
//    double *neule;
//    double *g, *temp_g;
//    neule = new double[this->dim_size]{0};
//    g = new double[this->dim_size]{0};
//    temp_g = new double[this->dim_size]{0};
//
//
//    for (int i = 0; i < contextIds.size(); i++) {
//
//        for (int k = 0; k < numOfKernels; k++) {
//
//            this->get_schoenberg_grad(temp_g, labels[i], this->kernelParams[k + 1], contextIds[i], centerId, current_lr);
//
//            for (int d = 0; d < this->dim_size; d++)
//                g[d] += (1.0 / numOfKernels) * temp_g[d];
//
//        }
//
//        for (int d = 0; d < this->dim_size; d++)
//            neule[d] += g[d];
//
//        for (int d = 0; d < this->dim_size; d++)
//            this->emb1[contextIds[i]][d] += g[d] - current_lr * this->lambda * (this->emb1[contextIds[i]][d]);
//    }
//    for (int d = 0; d < this->dim_size; d++)
//        this->emb0[centerId][d] += -neule[d] - current_lr * this->lambda * (this->emb0[centerId][d]);
//
//
//    delete[] neule;
//    delete[] g;
//    delete[] temp_g;
    /* ------------------------------------------------ */

}